

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O2

Error __thiscall asmjit::X86Assembler::align(X86Assembler *this,uint32_t mode,uint32_t alignment)

{
  Error EVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  long lVar5;
  uint8_t *puVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  float in_XMM0_Da;
  
  if (((this->super_Assembler).super_CodeEmitter._globalOptions & 4) != 0) {
    Logger::logf(((this->super_Assembler).super_CodeEmitter._code)->_logger,in_XMM0_Da);
  }
  if (mode < 3) {
    if (alignment < 2) {
      return 0;
    }
    if (alignment < 0x41 && (alignment - 1 & alignment) == 0) {
      puVar6 = (this->super_Assembler)._bufferPtr;
      lVar5 = (long)puVar6 - (long)(this->super_Assembler)._bufferData;
      uVar10 = (-(ulong)alignment & (ulong)(alignment - 1) + lVar5) - lVar5;
      if ((int)uVar10 == 0) {
        return 0;
      }
      if ((uVar10 & 0xffffffff) <= (ulong)((long)(this->super_Assembler)._bufferEnd - (long)puVar6))
      {
LAB_0015d09d:
        if (mode == 1) {
          uVar4 = 0xcc;
        }
        else if (mode == 0) {
          uVar4 = 0x90;
          if (((this->super_Assembler).super_CodeEmitter._globalHints & 1) != 0) {
            do {
              puVar3 = puVar6;
              uVar8 = (uint)uVar10;
              uVar7 = 9;
              if (uVar8 < 9) {
                uVar7 = uVar8;
              }
              uVar2 = uVar8;
              if (8 < (uVar10 & 0xffffffff)) {
                uVar2 = 9;
              }
              lVar5 = 0;
              do {
                puVar3[lVar5] = align::nopData[uVar7 - 1][lVar5];
                lVar5 = lVar5 + 1;
              } while (uVar2 != (uint)lVar5);
              uVar10 = (ulong)(uVar8 - uVar7);
              puVar6 = puVar3 + lVar5;
            } while (uVar8 - uVar7 != 0);
            puVar6 = puVar3 + lVar5;
            uVar10 = 0;
          }
        }
        else {
          uVar4 = '\0';
        }
        while (iVar9 = (int)uVar10, uVar10 = (ulong)(iVar9 - 1), iVar9 != 0) {
          *puVar6 = uVar4;
          puVar6 = puVar6 + 1;
        }
        (this->super_Assembler)._bufferPtr = puVar6;
        return 0;
      }
      EVar1 = CodeHolder::growBuffer
                        ((this->super_Assembler).super_CodeEmitter._code,
                         &((this->super_Assembler)._section)->_buffer,uVar10 & 0xffffffff);
      if (EVar1 == 0) {
        puVar6 = (this->super_Assembler)._bufferPtr;
        goto LAB_0015d09d;
      }
      goto LAB_0015d016;
    }
  }
  EVar1 = 3;
LAB_0015d016:
  EVar1 = CodeEmitter::setLastError((CodeEmitter *)this,EVar1,(char *)0x0);
  return EVar1;
}

Assistant:

Error X86Assembler::align(uint32_t mode, uint32_t alignment) {
#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    _code->_logger->logf("%s.align %u\n", _code->_logger->getIndentation(), alignment);
#endif // !ASMJIT_DISABLE_LOGGING

  if (mode >= kAlignCount)
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment <= 1)
    return kErrorOk;

  if (!Utils::isPowerOf2(alignment) || alignment > Globals::kMaxAlignment)
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t i = static_cast<uint32_t>(Utils::alignDiff<size_t>(getOffset(), alignment));
  if (i == 0)
    return kErrorOk;

  if (getRemainingSpace() < i) {
    Error err = _code->growBuffer(&_section->_buffer, i);
    if (ASMJIT_UNLIKELY(err)) return setLastError(err);
  }

  uint8_t* cursor = _bufferPtr;
  uint8_t pattern = 0x00;

  switch (mode) {
    case kAlignCode: {
      if (_globalHints & kHintOptimizedAlign) {
        // Intel 64 and IA-32 Architectures Software Developer's Manual - Volume 2B (NOP).
        enum { kMaxNopSize = 9 };

        static const uint8_t nopData[kMaxNopSize][kMaxNopSize] = {
          { 0x90 },
          { 0x66, 0x90 },
          { 0x0F, 0x1F, 0x00 },
          { 0x0F, 0x1F, 0x40, 0x00 },
          { 0x0F, 0x1F, 0x44, 0x00, 0x00 },
          { 0x66, 0x0F, 0x1F, 0x44, 0x00, 0x00 },
          { 0x0F, 0x1F, 0x80, 0x00, 0x00, 0x00, 0x00 },
          { 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 },
          { 0x66, 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 }
        };

        do {
          uint32_t n = std::min<uint32_t>(i, kMaxNopSize);
          const uint8_t* src = nopData[n - 1];

          i -= n;
          do {
            EMIT_BYTE(*src++);
          } while (--n);
        } while (i);
      }

      pattern = 0x90;
      break;
    }

    case kAlignData:
      pattern = 0xCC;
      break;

    case kAlignZero:
      // Pattern already set to zero.
      break;
  }

  while (i) {
    EMIT_BYTE(pattern);
    i--;
  }

  _bufferPtr = cursor;
  return kErrorOk;
}